

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_sv.c
# Opt level: O0

float dtl_sv_to_flt(dtl_sv_t *self,_Bool *ok)

{
  dtl_sv_type_id dVar1;
  float local_2c;
  float local_20;
  _Bool local_19;
  float retval;
  _Bool success;
  _Bool *ok_local;
  dtl_sv_t *self_local;
  
  local_19 = false;
  local_20 = 0.0;
  if (self != (dtl_sv_t *)0x0) {
    dVar1 = dtl_sv_type(self);
    switch(dVar1) {
    case DTL_SV_NONE:
      break;
    case DTL_SV_I32:
      local_20 = (float)(self->pAny->val).i32;
      local_19 = true;
      break;
    case DTL_SV_U32:
      local_20 = (float)(self->pAny->val).u32;
      local_19 = true;
      break;
    case DTL_SV_I64:
      local_20 = (float)(self->pAny->val).i64;
      local_19 = true;
      break;
    case DTL_SV_U64:
      local_2c = (float)(self->pAny->val).u64;
      local_20 = local_2c;
      local_19 = true;
      break;
    case DTL_SV_FLT:
      local_20 = (self->pAny->val).flt;
      local_19 = true;
      break;
    case DTL_SV_DBL:
      local_20 = (float)(self->pAny->val).dbl;
      local_19 = true;
      break;
    case DTL_SV_CHAR:
      local_20 = (float)(int)(self->pAny->val).cr;
      local_19 = true;
      break;
    case DTL_SV_BOOL:
      local_20 = (float)((self->pAny->val).cr & 1);
      local_19 = true;
      break;
    case DTL_SV_STR:
      break;
    case DTL_SV_PTR:
      break;
    case DTL_SV_DV:
      break;
    case DTL_SV_BYTES:
      break;
    case DTL_SV_BYTEARRAY:
    }
  }
  if (ok != (_Bool *)0x0) {
    *ok = local_19;
  }
  return local_20;
}

Assistant:

float dtl_sv_to_flt(const dtl_sv_t *self, bool *ok)
{
   bool success = false;
   float retval = 0u;

   if(self != 0)
   {
      switch(dtl_sv_type(self))
      {
      case DTL_SV_NONE:
         break;
      case DTL_SV_I32:
         retval = (float) self->pAny->val.i32;
         success = true;
         break;
      case DTL_SV_U32:
         retval = (float) self->pAny->val.u32;
         success = true;
         break;
      case DTL_SV_I64:
         retval = (float) self->pAny->val.i64;
         success = true;
         break;
      case DTL_SV_U64:
         retval = (float) self->pAny->val.u64;
         success = true;
         break;
      case DTL_SV_FLT:
         retval = self->pAny->val.flt;
         success = true;
         break;
      case DTL_SV_DBL:
         retval = (float) self->pAny->val.dbl;
         success = true;
         break;
      case DTL_SV_BOOL:
         retval = (float) self->pAny->val.bl;
         success = true;
         break;
      case DTL_SV_CHAR:
         retval = (float)self->pAny->val.cr;
         success = true;
         break;
      case DTL_SV_STR:
         break;
      case DTL_SV_PTR:
         break;
      case DTL_SV_DV:
         break;
      case DTL_SV_BYTES:
         break;
      case DTL_SV_BYTEARRAY:
         break;
      }
   }
   if (ok != 0)
   {
      *ok = success;
   }
   return retval;
}